

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O1

bool cmIncludeGuardCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  int iVar3;
  string *input;
  cmValue cVar4;
  cmState *pcVar5;
  cmake *this;
  bool bVar6;
  cmStateDirectory stateDir;
  string includeGuardVar;
  cmStateSnapshot dirSnapshot;
  undefined1 local_b0 [40];
  string local_88;
  string local_68;
  cmStateSnapshot local_48;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0x20 < (ulong)((long)pbVar1 - (long)__rhs)) {
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,
               "given an invalid number of arguments. The command takes at most 1 argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    return false;
  }
  if (__rhs == pbVar1) {
    iVar3 = 0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)__rhs);
    bVar6 = true;
    if (iVar3 == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar3 == 0) {
        iVar3 = 2;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"given an invalid scope: ",__rhs);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        iVar3 = 0;
        bVar6 = false;
      }
    }
    if (!bVar6) {
      return false;
    }
  }
  pcVar2 = status->Makefile;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_CURRENT_LIST_FILE","");
  input = (string *)cmMakefile::GetDefinition(pcVar2,&local_68);
  if (input == (string *)0x0) {
    input = &cmValue::Empty_abi_cxx11_;
  }
  local_88.field_2._M_allocated_capacity._0_7_ = 0x5547434e495f5f;
  local_88.field_2._7_4_ = 0x5f445241;
  local_88._M_string_length = 0xb;
  local_88.field_2._M_local_buf[0xb] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  cmSystemTools::ComputeStringMD5((string *)local_b0,input);
  std::__cxx11::string::_M_append((char *)&local_88,local_b0._0_8_);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = status->Makefile;
  if (iVar3 == 0) {
    bVar6 = cmMakefile::IsDefinitionSet(pcVar2,&local_88);
    if (bVar6) goto LAB_00314f1e;
    cmMakefile::AddDefinitionBool(pcVar2,&local_88,true);
  }
  else if (iVar3 == 1) {
    cVar4 = cmMakefile::GetProperty(pcVar2,&local_88);
    if (cVar4.Value == (string *)0x0) {
      cmMakefile::GetStateSnapshot(pcVar2);
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_68,(cmStateSnapshot *)local_b0);
      pcVar5 = cmStateSnapshot::GetState((cmStateSnapshot *)&local_68);
      bVar6 = pcVar5 != (cmState *)0x0;
      if (bVar6) {
        do {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_b0,(cmStateSnapshot *)&local_68);
          cVar4 = cmStateDirectory::GetProperty((cmStateDirectory *)local_b0,&local_88);
          if (cVar4.Value != (string *)0x0) break;
          cmStateSnapshot::GetBuildsystemDirectoryParent(&local_48,(cmStateSnapshot *)&local_68);
          local_68.field_2._M_allocated_capacity = local_48.Position.Position;
          local_68._M_dataplus._M_p = (pointer)local_48.State;
          local_68._M_string_length = (size_type)local_48.Position.Tree;
          pcVar5 = cmStateSnapshot::GetState((cmStateSnapshot *)&local_68);
          bVar6 = pcVar5 != (cmState *)0x0;
        } while (bVar6);
      }
      if (!bVar6) {
        cmMakefile::SetProperty(pcVar2,&local_88,"TRUE");
        goto LAB_00314f95;
      }
    }
LAB_00314f1e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&status->Variables,
                      (status->Variables).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    status->ReturnInvoked = true;
  }
  else {
    this = cmMakefile::GetCMakeInstance(pcVar2);
    cVar4 = cmake::GetProperty(this,&local_88);
    bVar6 = cVar4.Value != (string *)0x0;
    if (bVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&status->Variables,
                        (status->Variables).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      status->ReturnInvoked = true;
      goto LAB_00314f98;
    }
    cmake::SetProperty(this,&local_88,"TRUE");
  }
LAB_00314f95:
  bVar6 = true;
LAB_00314f98:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT17(local_88.field_2._M_local_buf[7],
                             local_88.field_2._M_allocated_capacity._0_7_) + 1);
  }
  return bVar6;
}

Assistant:

bool cmIncludeGuardCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() > 1) {
    status.SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      status.SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    *status.GetMakefile().GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = &status.GetMakefile();

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinitionBool(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}